

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * dbMallocRawFinish(sqlite3 *db,u64 n)

{
  void *pvVar1;
  void *p;
  u64 n_local;
  sqlite3 *db_local;
  
  pvVar1 = sqlite3Malloc(n);
  if (pvVar1 == (void *)0x0) {
    sqlite3OomFault(db);
  }
  return pvVar1;
}

Assistant:

static SQLITE_NOINLINE void *dbMallocRawFinish(sqlite3 *db, u64 n){
  void *p;
  assert( db!=0 );
  p = sqlite3Malloc(n);
  if( !p ) sqlite3OomFault(db);
  sqlite3MemdebugSetType(p,
         (db->lookaside.bDisable==0) ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP);
  return p;
}